

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtectorChain.cpp
# Opt level: O3

bool __thiscall
CppUnit::ProtectorChain::protect(ProtectorChain *this,Functor *functor,ProtectorContext *context)

{
  _Map_pointer pppPVar1;
  _Elt_pointer ppPVar2;
  Protector *pPVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  Functor *pFVar8;
  ulong uVar9;
  ulong uVar10;
  Protector **ppPVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auStack_98 [8];
  Functors functors;
  
  if ((this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    iVar7 = (*functor->_vptr_Functor[2])(functor);
    return SUB41(iVar7,0);
  }
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::_M_initialize_map
            ((_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)auStack_98,0);
  pppPVar1 = (this->m_protectors).
             super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  uVar6 = ((int)((ulong)((long)(this->m_protectors).
                               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->m_protectors).
                              super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
           (int)((ulong)((long)(this->m_protectors).
                               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->m_protectors).
                              super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)pppPVar1 -
                   *(int *)&(this->m_protectors).
                            super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(pppPVar1 == (_Map_pointer)0x0)) * 0x40) - 1;
  if (-1 < (int)uVar6) {
    lVar13 = (ulong)uVar6 * 8;
    uVar10 = (ulong)uVar6;
    do {
      pFVar8 = functor;
      if (functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_node !=
          (_Map_pointer)
          functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
          _M_impl.super__Deque_impl_data._M_map_size) {
        pFVar8 = (Functor *)
                 functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
        if ((_Elt_pointer)
            functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node ==
            functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur) {
          pFVar8 = functors.
                   super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
        }
        pFVar8 = (Functor *)pFVar8[-1]._vptr_Functor;
      }
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)operator_new(0x20);
      ppPVar2 = (this->m_protectors).
                super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar9 = ((long)ppPVar2 -
               (long)(this->m_protectors).
                     super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar10;
      if ((long)uVar9 < 0) {
        uVar12 = (long)uVar9 >> 6;
LAB_00126ca0:
        ppPVar11 = (this->m_protectors).
                   super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_node[uVar12] + uVar9 + uVar12 * -0x40;
      }
      else {
        if (0x3f < uVar9) {
          uVar12 = uVar9 >> 6;
          goto LAB_00126ca0;
        }
        ppPVar11 = (Protector **)((long)ppPVar2 + lVar13);
      }
      pPVar3 = *ppPVar11;
      *functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node = (Functor **)&PTR__Functor_00142a38;
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node[1] = (Functor **)pPVar3;
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node[2] = (Functor **)pFVar8;
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node[3] = (Functor **)context;
      std::deque<CppUnit::Functor*,std::allocator<CppUnit::Functor*>>::
      emplace_back<CppUnit::Functor*>
                ((deque<CppUnit::Functor*,std::allocator<CppUnit::Functor*>> *)auStack_98,
                 (Functor **)
                 &functors.
                  super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_node);
      lVar13 = lVar13 + -8;
      bVar4 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar4);
  }
  pFVar8 = (Functor *)
           functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
  if ((_Elt_pointer)
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_node ==
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    pFVar8 = functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
  }
  uVar5 = (*(code *)((Functor *)*pFVar8[-1]._vptr_Functor)[2]._vptr_Functor)();
  uVar6 = 0;
  do {
    uVar10 = (ulong)uVar6;
    pppPVar1 = (this->m_protectors).
               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    if (((long)(this->m_protectors).
               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->m_protectors).
               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)(this->m_protectors).
               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->m_protectors).
               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)pppPVar1 -
                  (long)(this->m_protectors).
                        super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppPVar1 == (_Map_pointer)0x0)) * 0x40 <= uVar10) {
      std::_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::~_Deque_base
                ((_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)auStack_98)
      ;
      return (bool)uVar5;
    }
    uVar9 = ((long)(functors.
                    super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                    _M_impl.super__Deque_impl_data._M_map_size -
                   (long)functors.
                         super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) + uVar10;
    if ((long)uVar9 < 0) {
      uVar10 = (long)uVar9 >> 6;
LAB_00126d8c:
      pFVar8 = functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last[uVar10] + uVar9 + uVar10 * -0x40;
    }
    else {
      if (0x3f < uVar9) {
        uVar10 = uVar9 >> 6;
        goto LAB_00126d8c;
      }
      pFVar8 = (Functor *)
               (functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                _M_impl.super__Deque_impl_data._M_map_size + uVar10 * 8);
    }
    if (pFVar8->_vptr_Functor != (_func_int **)0x0) {
      (**(code **)(*pFVar8->_vptr_Functor + 8))();
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool 
ProtectorChain::protect( const Functor &functor,
                         const ProtectorContext &context )
{
  if ( m_protectors.empty() )
    return functor();

  Functors functors;
  for ( int index = m_protectors.size()-1; index >= 0; --index )
  {
    const Functor &protectedFunctor = 
              functors.empty() ? functor : *functors.back();

    functors.push_back( new ProtectFunctor( m_protectors[index],
                                            protectedFunctor, 
                                            context ) );
  }

  const Functor &outermostFunctor = *functors.back();
  bool succeed = outermostFunctor();

  for ( unsigned int deletingIndex = 0; deletingIndex < m_protectors.size(); ++deletingIndex )
    delete functors[deletingIndex];

  return succeed;
}